

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_coefficients_to_group_delay.cc
# Opt level: O0

bool __thiscall
sptk::FilterCoefficientsToGroupDelay::Run
          (FilterCoefficientsToGroupDelay *this,
          vector<double,_std::allocator<double>_> *numerator_coefficients,
          vector<double,_std::allocator<double>_> *denominator_coefficients,
          vector<double,_std::allocator<double>_> *group_delay,Buffer *buffer)

{
  pointer *ppdVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  long in_R8;
  double dVar10;
  value_type vVar11;
  double numerator;
  double denominator;
  int i_1;
  double *yi;
  double *xi;
  double *yr;
  double *xr;
  double *output;
  int i;
  double *dst;
  double *src;
  int coefficients_length;
  int output_length;
  int denominator_length;
  int numerator_length;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffec8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffed8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  int iVar12;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffef0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffef8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff18;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff28;
  int local_c4;
  bool local_1;
  
  iVar3 = *(int *)(in_RDI._M_current + 1);
  iVar12 = *(int *)((long)in_RDI._M_current + 0xc);
  if ((((((ulong)in_RDI._M_current[0x12] & 1) == 0) ||
       (sVar4 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar4 != (long)(iVar3 + 1))) ||
      (sVar4 = std::vector<double,_std::allocator<double>_>::size(in_RDX),
      sVar4 != (long)(iVar12 + 1))) ||
     ((in_RCX == (vector<double,_std::allocator<double>_> *)0x0 || (in_R8 == 0)))) {
    local_1 = false;
  }
  else {
    iVar3 = *(int *)(in_RDI._M_current + 2) / 2 + 1;
    sVar4 = std::vector<double,_std::allocator<double>_>::size(in_RCX);
    if (sVar4 != (long)iVar3) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef0._M_current,
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    }
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x70));
    if (sVar4 != (long)*(int *)(in_RDI._M_current + 2)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef0._M_current,
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    }
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x88));
    if (sVar4 != (long)*(int *)(in_RDI._M_current + 2)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef0._M_current,
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    }
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x40));
    if (sVar4 != (long)(*(int *)((long)in_RDI._M_current + 0xc) + 1)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef0._M_current,
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    }
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec8._M_current);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator+((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
              in_stack_fffffffffffffed8._M_current,(difference_type)in_RDI._M_current);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec8._M_current);
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec8._M_current);
    std::
    reverse_copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               in_stack_fffffffffffffed8._M_current,in_RDI,in_stack_fffffffffffffec8);
    pvVar5 = std::vector<double,_std::allocator<double>_>::back
                       ((vector<double,_std::allocator<double>_> *)in_RDI._M_current);
    *pvVar5 = 1.0;
    bVar2 = Perform1DConvolution
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18
                      );
    if (bVar2) {
      sVar4 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x58));
      std::vector<double,_std::allocator<double>_>::begin
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec8._M_current);
      std::vector<double,_std::allocator<double>_>::end
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec8._M_current);
      std::vector<double,_std::allocator<double>_>::begin
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec8._M_current);
      __result._M_current._4_4_ = in_stack_fffffffffffffeec;
      __result._M_current._0_4_ = in_stack_fffffffffffffee8;
      std::
      copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,__result);
      std::vector<double,_std::allocator<double>_>::begin
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec8._M_current);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_stack_fffffffffffffed8._M_current,(difference_type)in_RDI._M_current);
      std::vector<double,_std::allocator<double>_>::end
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec8._M_current);
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_RDI._M_current);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x58),0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x88),0);
      for (local_c4 = 0; local_c4 < (int)sVar4; local_c4 = local_c4 + 1) {
        pvVar6[local_c4] = (double)local_c4 * pvVar5[local_c4];
      }
      std::vector<double,_std::allocator<double>_>::begin
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec8._M_current);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_stack_fffffffffffffed8._M_current,(difference_type)in_RDI._M_current);
      std::vector<double,_std::allocator<double>_>::end
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec8._M_current);
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_RDI._M_current);
      bVar2 = RealValuedFastFourierTransform::Run
                        ((RealValuedFastFourierTransform *)
                         CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                         (vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffffee0._M_current,
                         (vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffffed8._M_current,(Buffer *)in_RDI._M_current);
      if (bVar2) {
        bVar2 = RealValuedFastFourierTransform::Run
                          ((RealValuedFastFourierTransform *)
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                           (vector<double,_std::allocator<double>_> *)
                           in_stack_fffffffffffffee0._M_current,
                           (vector<double,_std::allocator<double>_> *)
                           in_stack_fffffffffffffed8._M_current,(Buffer *)in_RDI._M_current);
        if (bVar2) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,0);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x70),0);
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x88),0);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_R8 + 0xa0),0);
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_R8 + 0xb8),0);
          for (iVar12 = 0; iVar12 < iVar3; iVar12 = iVar12 + 1) {
            dVar10 = pvVar6[iVar12] * pvVar6[iVar12] + pvVar8[iVar12] * pvVar8[iVar12];
            if (((double)(((Buffer *)in_RDI._M_current)->imag_part_input_).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start != 1.0) ||
               (NAN((double)(((Buffer *)in_RDI._M_current)->imag_part_input_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start))) {
              dVar10 = pow(dVar10,(double)(((Buffer *)in_RDI._M_current)->imag_part_input_).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
            }
            pvVar5[iVar12] =
                 (pvVar6[iVar12] * pvVar7[iVar12] + pvVar8[iVar12] * pvVar9[iVar12]) / dVar10 -
                 (double)*(int *)((long)&(((Buffer *)in_RDI._M_current)->real_part_input_).
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start + 4);
            ppdVar1 = &(((Buffer *)in_RDI._M_current)->real_part_input_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            if (((double)*ppdVar1 != 1.0) || (NAN((double)*ppdVar1))) {
              if (pvVar5[iVar12] <= 0.0) {
                dVar10 = pow(-pvVar5[iVar12],
                             (double)(((Buffer *)in_RDI._M_current)->real_part_input_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
                vVar11 = -dVar10;
              }
              else {
                vVar11 = pow(pvVar5[iVar12],
                             (double)(((Buffer *)in_RDI._M_current)->real_part_input_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
              }
              pvVar5[iVar12] = vVar11;
            }
          }
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool FilterCoefficientsToGroupDelay::Run(
    const std::vector<double>& numerator_coefficients,
    const std::vector<double>& denominator_coefficients,
    std::vector<double>* group_delay,
    FilterCoefficientsToGroupDelay::Buffer* buffer) const {
  // Check inputs.
  const int numerator_length(num_numerator_order_ + 1);
  const int denominator_length(num_denominator_order_ + 1);
  if (!is_valid_ ||
      numerator_coefficients.size() !=
          static_cast<std::size_t>(numerator_length) ||
      denominator_coefficients.size() !=
          static_cast<std::size_t>(denominator_length) ||
      NULL == group_delay || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int output_length(fft_length_ / 2 + 1);
  if (group_delay->size() != static_cast<std::size_t>(output_length)) {
    group_delay->resize(output_length);
  }
  if (buffer->real_part1_.size() != static_cast<std::size_t>(fft_length_)) {
    buffer->real_part1_.resize(fft_length_);
  }
  if (buffer->real_part2_.size() != static_cast<std::size_t>(fft_length_)) {
    buffer->real_part2_.resize(fft_length_);
  }
  if (buffer->flipped_coefficients_.size() !=
      static_cast<std::size_t>(num_denominator_order_ + 1)) {
    buffer->flipped_coefficients_.resize(num_denominator_order_ + 1);
  }

  std::reverse_copy(denominator_coefficients.begin() + 1,
                    denominator_coefficients.end(),
                    buffer->flipped_coefficients_.begin());
  buffer->flipped_coefficients_.back() = 1.0;

  if (!Perform1DConvolution(numerator_coefficients,
                            buffer->flipped_coefficients_,
                            &buffer->convolved_coefficients_)) {
    return false;
  }
  const int coefficients_length(
      static_cast<int>(buffer->convolved_coefficients_.size()));

  std::copy(buffer->convolved_coefficients_.begin(),
            buffer->convolved_coefficients_.end(), buffer->real_part1_.begin());
  std::fill(buffer->real_part1_.begin() + coefficients_length,
            buffer->real_part1_.end(), 0.0);

  // Make ramped polynomial.
  {
    const double* src(&buffer->convolved_coefficients_[0]);
    double* dst(&buffer->real_part2_[0]);
    for (int i(0); i < coefficients_length; ++i) {
      dst[i] = i * src[i];
    }
  }
  std::fill(buffer->real_part2_.begin() + coefficients_length,
            buffer->real_part2_.end(), 0.0);

  if (!fast_fourier_transform_.Run(
          &buffer->real_part1_, &buffer->imag_part1_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  if (!fast_fourier_transform_.Run(
          &buffer->real_part2_, &buffer->imag_part2_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  double* output(&((*group_delay)[0]));
  const double* xr(&buffer->real_part1_[0]);
  const double* yr(&buffer->real_part2_[0]);
  const double* xi(&buffer->imag_part1_[0]);
  const double* yi(&buffer->imag_part2_[0]);

  for (int i(0); i < output_length; ++i) {
    double denominator(xr[i] * xr[i] + xi[i] * xi[i]);
    if (1.0 != gamma_) {
      denominator = std::pow(denominator, gamma_);
    }
    double numerator(xr[i] * yr[i] + xi[i] * yi[i]);
    output[i] = numerator / denominator - num_denominator_order_;
    if (1.0 != alpha_) {
      output[i] = (0.0 < output[i]) ? std::pow(output[i], alpha_)
                                    : -std::pow(-output[i], alpha_);
    }
  }

  return true;
}